

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Parser::parse(Parser *this,char *infile)

{
  pointer ptVar1;
  token tVar2;
  DatalogProgram *__s;
  _Rb_tree_header *p_Var3;
  exception e;
  
  Scanner::scan(this->s,infile);
  std::vector<tok,_std::allocator<tok>_>::operator=(&this->toks,&this->s->toks);
  ptVar1 = (this->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->it)._M_current = ptVar1;
  tVar2 = ptVar1->t;
  (this->curr).line = ptVar1->line;
  (this->curr).t = tVar2;
  std::__cxx11::string::_M_assign((string *)&(this->curr).s);
  __s = (DatalogProgram *)operator_new(0x90);
  p_Var3 = &(__s->domain)._M_t._M_impl.super__Rb_tree_header;
  memset(__s,0,0x90);
  (__s->domain)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (__s->domain)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (__s->domain)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->prog = __s;
  datalogProgram(this);
  match(this,END_FILE);
  return;
}

Assistant:

void Parser::parse(char * infile){
	try {
		s->scan(infile);
		toks = s->toks;

		it = toks.begin();
		curr = *it;
		prog = new DatalogProgram();
		// Predicate* p = new Predicate("BAR");
		// p->params.push_back(new Parameter((string)"FOO"));
		// prog->addScheme(p);
		datalogProgram();
//		cout << prog->toString() << endl;
		match(END_FILE);
//		cout << prog->toString() << endl;
	}
	catch (exception e) {
		throw;
	}
}